

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::reallocate
          (QPodArrayOps<QStringView> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QStringView>_*,_QStringView_*> pVar1;
  
  pVar1 = QTypedArrayData<QStringView>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QStringView>).d,
                     (this->super_QArrayDataPointer<QStringView>).ptr,alloc,option);
  (this->super_QArrayDataPointer<QStringView>).d = pVar1.first;
  (this->super_QArrayDataPointer<QStringView>).ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }